

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O2

ZyanStatus
ZydisFormatterATTPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  ZyanBool force_leading_number;
  ZyanStringView *pZVar2;
  undefined1 uVar3;
  ZyanBool uppercase;
  ZyanStringView *pZVar4;
  ZyanU64 ZVar5;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x180,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x181,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x182,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar1 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar1 < 0)) {
    return ZVar1;
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar5 = (context->operand->field_10).mem.disp.value;
      uVar3 = (undefined1)formatter->disp_padding;
      uppercase = formatter->hex_uppercase;
      force_leading_number = formatter->hex_force_leading_number;
      pZVar4 = formatter->number_format[1][0].string;
      pZVar2 = formatter->number_format[1][1].string;
      if ((long)ZVar5 < 0) {
        ZVar1 = ZydisStringAppendShort
                          (&buffer->string,(ZydisShortString *)ZydisStringAppendHexS_str_sub);
        if ((int)ZVar1 < 0) {
          return ZVar1;
        }
        if ((pZVar4 != (ZyanStringView *)0x0) &&
           (ZVar1 = ZydisStringAppend(&buffer->string,pZVar4), (int)ZVar1 < 0)) {
          return ZVar1;
        }
        ZVar5 = -ZVar5;
        pZVar4 = (ZyanStringView *)0x0;
      }
LAB_001163a9:
      ZVar1 = ZydisStringAppendHexU
                        (&buffer->string,ZVar5,uVar3,force_leading_number,uppercase,pZVar4,pZVar2);
      goto LAB_001163ae;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar5 = (context->operand->field_10).mem.disp.value;
    uVar3 = (undefined1)formatter->disp_padding;
    pZVar2 = formatter->number_format[0][0].string;
    pZVar4 = formatter->number_format[0][1].string;
    if ((long)ZVar5 < 0) {
      ZVar1 = ZydisStringAppendShort
                        (&buffer->string,(ZydisShortString *)ZydisStringAppendDecS_str_sub);
      if ((int)ZVar1 < 0) {
        return ZVar1;
      }
      if ((pZVar2 != (ZyanStringView *)0x0) &&
         (ZVar1 = ZydisStringAppend(&buffer->string,pZVar2), (int)ZVar1 < 0)) {
        return ZVar1;
      }
      ZVar5 = -ZVar5;
      pZVar2 = (ZyanStringView *)0x0;
    }
  }
  else {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar5 = (context->operand->field_10).mem.disp.value;
      uVar3 = (undefined1)formatter->disp_padding;
      force_leading_number = formatter->hex_force_leading_number;
      uppercase = formatter->hex_uppercase;
      pZVar4 = formatter->number_format[1][0].string;
      pZVar2 = formatter->number_format[1][1].string;
      goto LAB_001163a9;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar5 = (context->operand->field_10).mem.disp.value;
    uVar3 = (undefined1)formatter->disp_padding;
    pZVar2 = formatter->number_format[0][0].string;
    pZVar4 = formatter->number_format[0][1].string;
  }
  ZVar1 = ZydisStringAppendDecU(&buffer->string,ZVar5,uVar3,pZVar2,pZVar4);
LAB_001163ae:
  if (-1 < (int)ZVar1) {
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number, ZYAN_FALSE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}